

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_pub
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,secp256k1_keypair *keypair)

{
  secp256k1_callback *in_RDX;
  void *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,0xe1,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RDX == (secp256k1_callback *)0x0) {
      secp256k1_callback_call((secp256k1_callback *)0x0,in_stack_ffffffffffffffd8);
      local_4 = 0;
    }
    else {
      memcpy(in_RSI,in_RDX + 2,0x40);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_keypair_pub(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_keypair *keypair) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(keypair != NULL);

    memcpy(pubkey->data, &keypair->data[32], sizeof(*pubkey));
    return 1;
}